

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermediate.h
# Opt level: O3

void __thiscall
glslang::TIntermSymbol::TIntermSymbol
          (TIntermSymbol *this,longlong i,TString *n,EShLanguage s,TType *t,TString *mn)

{
  TPoolAllocator *pTVar1;
  
  TIntermTyped::TIntermTyped(&this->super_TIntermTyped,t);
  (this->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode =
       (_func_int **)&PTR_getLoc_00afc690;
  this->id = i;
  this->flattenSubset = -1;
  pTVar1 = GetThreadPoolAllocator();
  (this->name)._M_dataplus.super_allocator_type.allocator = pTVar1;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  this->stage = s;
  pTVar1 = GetThreadPoolAllocator();
  (this->mangledName)._M_dataplus.super_allocator_type.allocator = pTVar1;
  (this->mangledName)._M_dataplus._M_p = (pointer)&(this->mangledName).field_2;
  (this->mangledName)._M_string_length = 0;
  (this->mangledName).field_2._M_local_buf[0] = '\0';
  (this->constArray)._vptr_TConstUnionArray = (_func_int **)&PTR__TConstUnionArray_00af64b8;
  (this->constArray).unionArray = (TConstUnionVector *)0x0;
  this->constSubtree = (TIntermTyped *)0x0;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  _M_assign(&this->name,n);
  if (mn == (TString *)0x0) {
    mn = n;
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  _M_assign(&this->mangledName,mn);
  return;
}

Assistant:

TIntermSymbol(long long i, const TString& n, EShLanguage s, const TType& t, const TString* mn = nullptr)
        : TIntermTyped(t), id(i), flattenSubset(-1), stage(s), constSubtree(nullptr) { 
        name = n;
        if (mn) {
            mangledName = *mn;
        } else {
            mangledName = n;
        }
    }